

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::IncorrectConstruction::~IncorrectConstruction(IncorrectConstruction *this)

{
  IncorrectConstruction *this_local;
  
  ~IncorrectConstruction(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

static IncorrectConstruction PositionalFlag(std::string name) {
        return IncorrectConstruction(name + ": Flags cannot be positional");
    }